

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O1

void ndn_key_storage_delete_ecc_key(uint32_t key_id)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  
  puVar2 = &storage.ecc_prv_keys[0].key_id;
  lVar3 = 0;
  do {
    uVar1 = *(uint32_t *)((long)(&storage.ecc_pub_keys[0].abs_key + 1) + lVar3);
    if (uVar1 == key_id && uVar1 != 0xffffffff) {
      *(undefined4 *)((long)(&storage.ecc_pub_keys[0].abs_key + 1) + lVar3) = 0xffffffff;
      *puVar2 = 0xffffffff;
      return;
    }
    puVar2 = puVar2 + 0xb;
    lVar3 = lVar3 + 0x4c;
  } while (lVar3 != 0x2f8);
  return;
}

Assistant:

void
ndn_key_storage_delete_ecc_key(uint32_t key_id)
{
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.ecc_pub_keys[i].key_id != NDN_SEC_INVALID_KEY_ID) {
      if (key_id == storage.ecc_pub_keys[i].key_id) {
        storage.ecc_pub_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        storage.ecc_prv_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        return;
      }
    }
  }
}